

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shared-validator.cc
# Opt level: O2

Result __thiscall
wabt::SharedValidator::CheckInstr(SharedValidator *this,Opcode opcode,Location *loc)

{
  size_t sVar1;
  undefined8 uVar2;
  bool bVar3;
  char *pcVar4;
  Enum EVar5;
  Opcode opcode_local;
  
  sVar1 = (loc->filename)._M_len;
  pcVar4 = (loc->filename)._M_str;
  uVar2 = *(undefined8 *)((long)&loc->field_1 + 8);
  (this->expr_loc_).field_1.field_1.offset = (loc->field_1).field_1.offset;
  *(undefined8 *)((long)&(this->expr_loc_).field_1 + 8) = uVar2;
  (this->expr_loc_).filename._M_len = sVar1;
  (this->expr_loc_).filename._M_str = pcVar4;
  EVar5 = Ok;
  if (this->in_init_expr_ == true) {
    opcode_local = opcode;
    bVar3 = ValidInitOpcode(this,opcode);
    if (!bVar3) {
      pcVar4 = Opcode::GetName(&opcode_local);
      PrintError(this,loc,"invalid initializer: instruction not valid in initializer expression: %s"
                 ,pcVar4);
      EVar5 = Error;
    }
  }
  return (Result)EVar5;
}

Assistant:

Result SharedValidator::CheckInstr(Opcode opcode, const Location& loc) {
  expr_loc_ = loc;
  if (in_init_expr_ && !ValidInitOpcode(opcode)) {
    PrintError(loc,
               "invalid initializer: instruction not valid in initializer "
               "expression: %s",
               opcode.GetName());
    return Result::Error;
  }
  return Result::Ok;
}